

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.hpp
# Opt level: O2

Image4u * eos::core::image::resize
                    (Image4u *__return_storage_ptr__,Image4u *image,int width,int height)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Pixel<unsigned_char,_4> *pPVar8;
  int a;
  int iVar9;
  int b;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int num_texels;
  int source_x;
  int local_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  int local_78;
  int local_74;
  Image4u *local_70;
  float local_64;
  int local_60;
  float local_5c;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
  local_48;
  
  local_64 = (float)width / (float)image->width_;
  local_5c = (float)height / (float)image->height_;
  local_70 = __return_storage_ptr__;
  Image<eos::core::Pixel<unsigned_char,_4>_>::Image(__return_storage_ptr__,height,width);
  local_74 = 0;
  if (height < 1) {
    height = 0;
  }
  local_60 = width;
  local_54 = height;
  if (width < 1) {
    local_60 = 0;
  }
  for (; local_74 != local_60; local_74 = local_74 + 1) {
    fVar11 = (float)local_74 / local_64;
    fVar13 = ((float)local_74 + 1.0) / local_64;
    fVar12 = ceilf(fVar11);
    local_58 = (int)fVar12;
    local_4c = floorf(fVar13);
    fVar11 = roundf(fVar11);
    local_78 = (int)fVar11;
    iVar9 = 0;
    while( true ) {
      if (iVar9 == local_54) break;
      Eigen::DenseBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::Zero();
      Eigen::PlainObjectBase<Eigen::Matrix<int,4,1,0,4,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>>>
                ((PlainObjectBase<Eigen::Matrix<int,4,1,0,4,1>> *)&local_88,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
                  *)&local_48);
      fVar11 = (float)iVar9 / local_5c;
      fVar13 = ((float)iVar9 + 1.0) / local_5c;
      local_8c = 0;
      local_50 = iVar9;
      fVar12 = ceilf(fVar11);
      fVar13 = floorf(fVar13);
      for (iVar9 = local_58; iVar10 = (int)fVar12, (float)iVar9 <= local_4c; iVar9 = iVar9 + 1) {
        for (; (float)iVar10 <= fVar13; iVar10 = iVar10 + 1) {
          if ((iVar9 < image->width_) && (iVar10 < image->height_)) {
            local_8c = local_8c + 1;
            pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar10,iVar9);
            bVar1 = (pPVar8->data_)._M_elems[0];
            pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar10,iVar9);
            bVar2 = (pPVar8->data_)._M_elems[1];
            pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar10,iVar9);
            bVar3 = (pPVar8->data_)._M_elems[2];
            pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar10,iVar9);
            local_88 = bVar1 + local_88;
            uStack_84 = bVar2 + uStack_84;
            uStack_80 = bVar3 + uStack_80;
            uStack_7c = (pPVar8->data_)._M_elems[3] + uStack_7c;
          }
        }
      }
      if (local_8c < 1) {
        fVar11 = roundf(fVar11);
        iVar9 = local_78;
        iVar10 = (int)fVar11;
        if ((iVar10 < image->height_) && (local_78 < image->width_)) {
          pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar10,local_78);
          bVar1 = (pPVar8->data_)._M_elems[0];
          pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar10,iVar9);
          bVar2 = (pPVar8->data_)._M_elems[1];
          pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar10,iVar9);
          bVar3 = (pPVar8->data_)._M_elems[2];
          pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar10,iVar9);
          local_88 = (uint)bVar1;
          uStack_84 = (uint)bVar2;
          uStack_80 = (uint)bVar3;
          uStack_7c = (uint)(pPVar8->data_)._M_elems[3];
        }
      }
      else {
        Eigen::MatrixBase<Eigen::Matrix<int,4,1,0,4,1>>::operator/
                  (&local_48,(MatrixBase<Eigen::Matrix<int,4,1,0,4,1>> *)&local_88,&local_8c);
        Eigen::internal::
        call_assignment<Eigen::Matrix<int,4,1,0,4,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,int>,Eigen::Matrix<int,4,1,0,4,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>const>const>>
                  ((Matrix<int,_4,_1,_0,_4,_1> *)&local_88,&local_48);
      }
      iVar9 = local_50;
      uVar7 = uStack_7c;
      uVar6 = uStack_80;
      uVar5 = uStack_84;
      uVar4 = local_88;
      pPVar8 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(local_70,local_50,local_74);
      *(uint *)(pPVar8->data_)._M_elems =
           (uVar5 & 0xff) << 8 | (uVar6 & 0xff) << 0x10 | uVar7 << 0x18 | uVar4 & 0xff;
      iVar9 = iVar9 + 1;
    }
  }
  return local_70;
}

Assistant:

inline eos::core::Image4u resize(const eos::core::Image4u& image, int width, int height)
{
    using Eigen::Vector4i;
    using std::ceil;
    using std::floor;
    using std::round;
    using std::uint8_t;

    const float scaling_width = static_cast<float>(width) / image.width();
    const float scaling_height = static_cast<float>(height) / image.height();

    eos::core::Image4u resized_image(height, width);
    for (int w = 0; w < width; ++w)
    {
        for (int h = 0; h < height; ++h)
        {
            const float left = (static_cast<float>(w)) / scaling_width;
            const float right = (static_cast<float>(w) + 1.0f) / scaling_width;
            const float bottom = (static_cast<float>(h)) / scaling_height;
            const float top = (static_cast<float>(h) + 1.0f) / scaling_height;

            Vector4i color = Vector4i::Zero(); // std::uint8_t actually.
            int num_texels = 0;
            // loop over square in which quadrangle out of the four corners of pixel is
            for (int a = ceil(left); a <= floor(right); ++a)
            {
                for (int b = ceil(bottom); b <= floor(top); ++b)
                {
                    // check if texel is in image
                    if (a < image.width() && b < image.height())
                    {
                        num_texels++;
                        color += Vector4i(image(b, a)[0], image(b, a)[1], image(b, a)[2], image(b, a)[3]);
                    }
                }
            }
            if (num_texels > 0)
                color = color / num_texels;
            else
            { // if no corresponding texel found, nearest neighbour interpolation
              // calculate corresponding position of dst_coord pixel center in image (src)
                const int source_x = round(static_cast<float>(w) / scaling_width);
                const int source_y = round(static_cast<float>(h) / scaling_height);

                if (source_y < image.height() && source_x < image.width())
                {
                    color = Vector4i(image(source_y, source_x)[0], image(source_y, source_x)[1],
                                     image(source_y, source_x)[2], image(source_y, source_x)[3]);
                }
            }

            resized_image(h, w) = {
                static_cast<std::uint8_t>(round(color[0])), static_cast<std::uint8_t>(round(color[1])),
                static_cast<std::uint8_t>(round(color[2])), static_cast<std::uint8_t>(round(color[3]))};
        }
    }

    return resized_image;
}